

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUseMangledMesaCommand.cxx
# Opt level: O0

void __thiscall
cmUseMangledMesaCommand::CopyAndFullPathMesaHeader
          (cmUseMangledMesaCommand *this,char *source,char *outdir)

{
  byte bVar1;
  bool bVar2;
  char *pcVar3;
  ostream *poVar4;
  char *destination;
  string local_7e0;
  undefined1 local_7c0 [8];
  string gfile;
  string includeFile;
  RegularExpression glLine;
  RegularExpression glDirLine;
  RegularExpression includeLine;
  string inLine;
  ifstream fin;
  undefined1 local_2e0 [8];
  ofstream fout;
  string tempOutputFile;
  string local_b8 [8];
  string outFile;
  allocator local_81;
  string local_80;
  undefined1 local_60 [8];
  string file;
  string dir;
  char *outdir_local;
  char *source_local;
  cmUseMangledMesaCommand *this_local;
  
  std::__cxx11::string::string((string *)(file.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_80,source,&local_81);
  cmsys::SystemTools::SplitProgramPath
            (&local_80,(string *)((long)&file.field_2 + 8),(string *)local_60,true);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_b8,outdir,(allocator *)(tempOutputFile.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(tempOutputFile.field_2._M_local_buf + 0xf));
  std::__cxx11::string::operator+=(local_b8,"/");
  std::__cxx11::string::operator+=(local_b8,(string *)local_60);
  std::__cxx11::string::string((string *)&fout.field_0x1f8,local_b8);
  std::__cxx11::string::operator+=((string *)&fout.field_0x1f8,".tmp");
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_2e0,pcVar3,_S_out);
  bVar1 = std::ios::operator!((ios *)(local_2e0 + (long)*(_func_int **)((long)local_2e0 + -0x18)));
  if ((bVar1 & 1) == 0) {
    std::ifstream::ifstream((void *)((long)&inLine.field_2 + 8),source,_S_in);
    bVar1 = std::ios::operator!((ios *)((long)&inLine.field_2 +
                                       *(long *)(inLine.field_2._8_8_ + -0x18) + 8));
    if ((bVar1 & 1) == 0) {
      std::__cxx11::string::string((string *)&includeLine.searchstring);
      cmsys::RegularExpression::RegularExpression
                ((RegularExpression *)&glDirLine.searchstring,
                 "^[ \t]*#[ \t]*include[ \t]*[<\"]([^\">]+)[\">]");
      cmsys::RegularExpression::RegularExpression
                ((RegularExpression *)&glLine.searchstring,"(gl|GL)(/|\\\\)([^<\"]+)");
      cmsys::RegularExpression::RegularExpression
                ((RegularExpression *)((long)&includeFile.field_2 + 8),"(gl|GL|xmesa)");
      while (bVar2 = cmsys::SystemTools::GetLineFromStream
                               ((istream *)(inLine.field_2._M_local_buf + 8),
                                (string *)&includeLine.searchstring,(bool *)0x0,-1), bVar2) {
        pcVar3 = (char *)std::__cxx11::string::c_str();
        bVar2 = cmsys::RegularExpression::find((RegularExpression *)&glDirLine.searchstring,pcVar3);
        if (bVar2) {
          cmsys::RegularExpression::match_abi_cxx11_
                    ((string *)((long)&gfile.field_2 + 8),
                     (RegularExpression *)&glDirLine.searchstring,1);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          bVar2 = cmsys::RegularExpression::find((RegularExpression *)&glLine.searchstring,pcVar3);
          if (bVar2) {
            cmsys::RegularExpression::match_abi_cxx11_
                      ((string *)local_7c0,(RegularExpression *)&glLine.searchstring,3);
            poVar4 = std::operator<<((ostream *)local_2e0,"#include \"");
            poVar4 = std::operator<<(poVar4,outdir);
            poVar4 = std::operator<<(poVar4,"/");
            poVar4 = std::operator<<(poVar4,(string *)local_7c0);
            std::operator<<(poVar4,"\"\n");
            std::__cxx11::string::~string((string *)local_7c0);
          }
          else {
            pcVar3 = (char *)std::__cxx11::string::c_str();
            bVar2 = cmsys::RegularExpression::find
                              ((RegularExpression *)((long)&includeFile.field_2 + 8),pcVar3);
            if (bVar2) {
              poVar4 = std::operator<<((ostream *)local_2e0,"#include \"");
              poVar4 = std::operator<<(poVar4,outdir);
              poVar4 = std::operator<<(poVar4,"/");
              cmsys::RegularExpression::match_abi_cxx11_
                        (&local_7e0,(RegularExpression *)&glDirLine.searchstring,1);
              poVar4 = std::operator<<(poVar4,(string *)&local_7e0);
              std::operator<<(poVar4,"\"\n");
              std::__cxx11::string::~string((string *)&local_7e0);
            }
            else {
              poVar4 = std::operator<<((ostream *)local_2e0,(string *)&includeLine.searchstring);
              std::operator<<(poVar4,"\n");
            }
          }
          std::__cxx11::string::~string((string *)(gfile.field_2._M_local_buf + 8));
        }
        else {
          poVar4 = std::operator<<((ostream *)local_2e0,(string *)&includeLine.searchstring);
          std::operator<<(poVar4,"\n");
        }
      }
      std::ifstream::close();
      std::ofstream::close();
      pcVar3 = (char *)std::__cxx11::string::c_str();
      destination = (char *)std::__cxx11::string::c_str();
      cmSystemTools::CopyFileIfDifferent(pcVar3,destination);
      cmsys::SystemTools::RemoveFile((string *)&fout.field_0x1f8);
      cmsys::RegularExpression::~RegularExpression
                ((RegularExpression *)((long)&includeFile.field_2 + 8));
      cmsys::RegularExpression::~RegularExpression((RegularExpression *)&glLine.searchstring);
      cmsys::RegularExpression::~RegularExpression((RegularExpression *)&glDirLine.searchstring);
      std::__cxx11::string::~string((string *)&includeLine.searchstring);
    }
    else {
      cmSystemTools::Error
                ("Could not open file for read in copy operation",source,(char *)0x0,(char *)0x0);
    }
    std::ifstream::~ifstream((void *)((long)&inLine.field_2 + 8));
  }
  else {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cmSystemTools::Error
              ("Could not open file for write in copy operation: ",pcVar3,outdir,(char *)0x0);
    cmSystemTools::ReportLastSystemError("");
  }
  std::ofstream::~ofstream(local_2e0);
  std::__cxx11::string::~string((string *)&fout.field_0x1f8);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(file.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmUseMangledMesaCommand::CopyAndFullPathMesaHeader(const char* source,
                                                        const char* outdir)
{
  std::string dir, file;
  cmSystemTools::SplitProgramPath(source, dir, file);
  std::string outFile = outdir;
  outFile += "/";
  outFile += file;
  std::string tempOutputFile = outFile;
  tempOutputFile += ".tmp";
  cmsys::ofstream fout(tempOutputFile.c_str());
  if (!fout) {
    cmSystemTools::Error("Could not open file for write in copy operation: ",
                         tempOutputFile.c_str(), outdir);
    cmSystemTools::ReportLastSystemError("");
    return;
  }
  cmsys::ifstream fin(source);
  if (!fin) {
    cmSystemTools::Error("Could not open file for read in copy operation",
                         source);
    return;
  }
  // now copy input to output and expand variables in the
  // input file at the same time
  std::string inLine;
  // regular expression for any #include line
  cmsys::RegularExpression includeLine(
    "^[ \t]*#[ \t]*include[ \t]*[<\"]([^\">]+)[\">]");
  // regular expression for gl/ or GL/ in a file (match(1) of above)
  cmsys::RegularExpression glDirLine("(gl|GL)(/|\\\\)([^<\"]+)");
  // regular expression for gl GL or xmesa in a file (match(1) of above)
  cmsys::RegularExpression glLine("(gl|GL|xmesa)");
  while (cmSystemTools::GetLineFromStream(fin, inLine)) {
    if (includeLine.find(inLine.c_str())) {
      std::string includeFile = includeLine.match(1);
      if (glDirLine.find(includeFile.c_str())) {
        std::string gfile = glDirLine.match(3);
        fout << "#include \"" << outdir << "/" << gfile << "\"\n";
      } else if (glLine.find(includeFile.c_str())) {
        fout << "#include \"" << outdir << "/" << includeLine.match(1)
             << "\"\n";
      } else {
        fout << inLine << "\n";
      }
    } else {
      fout << inLine << "\n";
    }
  }
  // close the files before attempting to copy
  fin.close();
  fout.close();
  cmSystemTools::CopyFileIfDifferent(tempOutputFile.c_str(), outFile.c_str());
  cmSystemTools::RemoveFile(tempOutputFile);
}